

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::LiteralToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,
          LiteralType literal_type)

{
  Location loc;
  LiteralType type;
  TokenType token_type_00;
  string_view text;
  Literal local_50;
  Location local_38;
  LiteralType local_18;
  TokenType local_14;
  LiteralType literal_type_local;
  TokenType token_type_local;
  WastLexer *this_local;
  
  local_18 = literal_type;
  local_14 = token_type;
  _literal_type_local = this;
  GetLocation(&local_38,this);
  token_type_00 = local_14;
  type = local_18;
  text = GetText(this,0);
  Literal::Literal(&local_50,type,text);
  loc.filename.size_ = local_38.filename.size_;
  loc.filename.data_ = local_38.filename.data_;
  loc.field_1.field_1.offset = local_38.field_1.field_1.offset;
  loc.field_1._8_8_ = local_38.field_1._8_8_;
  Token::Token(__return_storage_ptr__,loc,token_type_00,&local_50);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::LiteralToken(TokenType token_type, LiteralType literal_type) {
  return Token(GetLocation(), token_type, Literal(literal_type, GetText()));
}